

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::BufferCheck
          (DrawIndirectBase *this,CDataArray *dataRef,uint widthRef,uint heightRef,void *bufTest,
          uint widthTest,uint heightTest,uint offsetYRef,uint offsetYTest)

{
  runtime_error *this_00;
  reference __dest;
  long lVar1;
  allocator<unsigned_int> local_65;
  value_type_conflict4 local_64;
  undefined1 local_60 [8];
  CDataArray dataTest;
  uint widthTest_local;
  void *bufTest_local;
  uint heightRef_local;
  uint widthRef_local;
  CDataArray *dataRef_local;
  DrawIndirectBase *this_local;
  
  if (bufTest == (void *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid test buffer!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_64 = 0;
  std::allocator<unsigned_int>::allocator(&local_65);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
             (ulong)(widthTest * heightTest),&local_64,&local_65);
  std::allocator<unsigned_int>::~allocator(&local_65);
  __dest = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,0);
  memcpy(__dest,bufTest,(ulong)(widthTest * heightTest) << 2);
  lVar1 = DataCompare<unsigned_int>
                    (this,dataRef,widthRef,heightRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,widthTest,
                     heightTest,offsetYRef,offsetYTest);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  return lVar1;
}

Assistant:

long BufferCheck(const CDataArray& dataRef, unsigned int widthRef, unsigned int heightRef, const void* bufTest,
					 unsigned int widthTest, unsigned int heightTest, unsigned int offsetYRef = 0,
					 unsigned int offsetYTest = 0)
	{
		if (bufTest == 0)
		{
			throw std::runtime_error("Invalid test buffer!");
		}

		CDataArray dataTest(widthTest * heightTest, 0);
		memcpy(&dataTest[0], bufTest, widthTest * heightTest * sizeof(unsigned int));

		return DataCompare(dataRef, widthRef, heightRef, dataTest, widthTest, heightTest, offsetYRef, offsetYTest);
	}